

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_remove_story_dependencies.hpp
# Opt level: O1

void PatchRemoveStoryDependencies::make_gumi_boulder_push_not_story_dependant(World *world)

{
  map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
  *this;
  pointer pEVar1;
  pointer *ppEVar2;
  pointer ppEVar3;
  Entity *pEVar4;
  pointer pEVar5;
  mapped_type *ppMVar6;
  EntityType *pEVar7;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  string local_50;
  
  local_50._M_dataplus._M_p._0_2_ = 0x1c1;
  this = &world->_maps;
  ppMVar6 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(this,(key_type *)&local_50);
  ppEVar3 = ((*ppMVar6)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)((long)((*ppMVar6)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3) < 7) {
    uVar10 = 6;
  }
  else {
    pEVar4 = ppEVar3[6];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"large_thin_yellow_platform","");
    pEVar7 = World::entity_type(world,&local_50);
    (pEVar4->_attrs).type_id = pEVar7->_id;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    (pEVar4->_attrs).entity_to_use_tiles_from = (Entity *)0x0;
    (pEVar4->_attrs).position.half_z = true;
    (pEVar4->_attrs).palette = '\0';
    local_50._M_dataplus._M_p._0_2_ = 0x1c1;
    ppMVar6 = std::
              map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
              ::at(this,(key_type *)&local_50);
    Map::remove_entity(*ppMVar6,'\x04',true);
    local_50._M_dataplus._M_p._0_2_ = 0x1c1;
    ppMVar6 = std::
              map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
              ::at(this,(key_type *)&local_50);
    ppEVar3 = ((*ppMVar6)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)((*ppMVar6)->_entities).
                      super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3) < 3) {
      uVar10 = 2;
    }
    else {
      pEVar4 = ppEVar3[2];
      lVar8 = *(long *)&(pEVar4->_attrs).mask_flags.
                        super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                        super__Vector_impl_data;
      pEVar5 = *(pointer *)
                ((long)&(pEVar4->_attrs).mask_flags.
                        super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> + 8);
      pEVar1 = (pointer)(lVar8 + 0x10);
      if ((pEVar1 != pEVar5) && (lVar9 = (long)pEVar5 - (long)pEVar1 >> 4, 0 < lVar9)) {
        lVar9 = lVar9 + 1;
        lVar8 = lVar8 + 0x1b;
        do {
          *(undefined4 *)(lVar8 + -0x13) = *(undefined4 *)(lVar8 + -3);
          lVar9 = lVar9 + -1;
          lVar8 = lVar8 + 0x10;
        } while (1 < lVar9);
      }
      ppEVar2 = (pointer *)
                ((long)&(pEVar4->_attrs).mask_flags.
                        super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> + 8);
      *ppEVar2 = *ppEVar2 + -1;
      local_50._M_dataplus._M_p._0_2_ = 0x1c1;
      ppMVar6 = std::
                map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
                ::at(this,(key_type *)&local_50);
      ppEVar3 = ((*ppMVar6)->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (3 < (ulong)((long)((*ppMVar6)->_entities).
                            super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3)) {
        pEVar4 = ppEVar3[3];
        lVar8 = *(long *)&(pEVar4->_attrs).mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data;
        pEVar5 = *(pointer *)
                  ((long)&(pEVar4->_attrs).mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> + 8);
        pEVar1 = (pointer)(lVar8 + 0x10);
        if ((pEVar1 != pEVar5) && (lVar9 = (long)pEVar5 - (long)pEVar1 >> 4, 0 < lVar9)) {
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 0x1b;
          do {
            *(undefined4 *)(lVar8 + -0x13) = *(undefined4 *)(lVar8 + -3);
            lVar9 = lVar9 + -1;
            lVar8 = lVar8 + 0x10;
          } while (1 < lVar9);
        }
        ppEVar2 = (pointer *)
                  ((long)&(pEVar4->_attrs).mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> + 8);
        *ppEVar2 = *ppEVar2 + -1;
        return;
      }
      uVar10 = 3;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar10);
}

Assistant:

static void make_gumi_boulder_push_not_story_dependant(World& world)
    {
        // Turn the last boulder into a platform to prevent any softlock
        Entity* last_boulder = world.map(MAP_ROUTE_GUMI_RYUMA_BOULDER)->entity(6);
        last_boulder->entity_type_id(world.entity_type("large_thin_yellow_platform")->id());
        last_boulder->entity_to_use_tiles_from(nullptr);
        last_boulder->position().half_z = true;
        last_boulder->palette(0);

        // Always remove Pockets from Gumi boulder map
        world.map(MAP_ROUTE_GUMI_RYUMA_BOULDER)->remove_entity(4);

        // Erase the first entity mask for each bear which makes them only appear under a specific scenario requirement
        std::vector<EntityMaskFlag>& first_bear_masks = world.map(MAP_ROUTE_GUMI_RYUMA_BOULDER)->entity(2)->mask_flags();
        first_bear_masks.erase(first_bear_masks.begin());

        std::vector<EntityMaskFlag>& second_bear_masks = world.map(MAP_ROUTE_GUMI_RYUMA_BOULDER)->entity(3)->mask_flags();
        second_bear_masks.erase(second_bear_masks.begin());
    }